

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

ON_3dPoint *
ON_Texture::WcsBoxMapping(ON_3dPoint *__return_storage_ptr__,ON_3dPoint *pt,ON_3dVector *n)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  int i;
  int iVar5;
  double dVar6;
  
  uVar3 = (ulong)(ABS(pt->x) < ABS(pt->y));
  if (ABS((&pt->x)[uVar3]) < ABS(pt->z)) {
    uVar3 = 2;
  }
  iVar5 = (int)uVar3 * 2 + 2;
  if ((&pt->x)[uVar3] <= 0.0 && (&pt->x)[uVar3] != 0.0) {
    iVar5 = (int)uVar3 * 2 + 1;
  }
  uVar3 = (ulong)(ABS(n->x) < ABS(n->y));
  if (ABS((&n->x)[uVar3]) < ABS(n->z)) {
    uVar3 = 2;
  }
  i = (int)uVar3;
  dVar6 = ON_3dVector::operator[](n,i);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    if (0.0 <= dVar6) {
      if (0.0 < dVar6) {
        iVar5 = i * 2 + 2;
      }
    }
    else {
      iVar5 = i * 2 + 1;
    }
  }
  pdVar1 = &pt->y;
  pdVar2 = &pt->z;
  pdVar4 = pdVar1;
  switch(iVar5) {
  case 1:
    dVar6 = -*pdVar1;
    pdVar4 = pdVar2;
    break;
  case 2:
    dVar6 = *pdVar1;
    pdVar4 = pdVar2;
    break;
  case 3:
    dVar6 = pt->x;
    pdVar4 = pdVar2;
    pt = (ON_3dPoint *)pdVar1;
    break;
  case 4:
    dVar6 = -pt->x;
    pdVar4 = pdVar2;
    pt = (ON_3dPoint *)pdVar1;
    break;
  case 5:
    dVar6 = -pt->x;
    pt = (ON_3dPoint *)pdVar2;
    break;
  default:
    dVar6 = pt->x;
    pt = (ON_3dPoint *)pdVar2;
  }
  __return_storage_ptr__->x = dVar6;
  __return_storage_ptr__->y = *pdVar4;
  __return_storage_ptr__->z = pt->x;
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Texture::WcsBoxMapping(const ON_3dPoint& pt, const ON_3dVector& n)
{
  // This code is moved here from CRhRdkTexture::WcsBoxMapping

  int side0 = 0;

  const ON_3dPoint& rst(pt);

  // set side0 = side closest to the point
  int side1 = (std::abs(rst.x) >= std::abs(rst.y)) ? 0 : 1;
  if (std::abs(rst.z) > std::abs(((double*)&rst.x)[side1]))
    side1 = 2;

  double t1 = (&rst.x)[side1];
  if (t1 < 0.0)
    side0 = 2 * side1 + 1;
  else
    side0 = 2 * side1 + 2;

  side1 = (std::abs(n.x) >= std::abs(n.y)) ? 0 : 1;
  if (std::abs(n.z) > std::abs((&n.x)[side1]))
  {
    side1 = 2;
  }

  t1 = n[side1];
  if (0.0 != t1)
  {
    if (t1 < 0.0)
      side0 = 2 * side1 + 1;
    else
      if (t1 > 0.0)
        side0 = 2 * side1 + 2;
  }

  // side flag
  //  1 =  left side (x=-1)
  //  2 =  right side (x=+1)
  //  3 =  back side (y=-1)
  //  4 =  front side (y=+1)
  //  5 =  bottom side (z=-1)
  //  6 =  top side (z=+1)
  ON_3dPoint v;
  switch (side0)
  {
  case 1:
    v.x = -pt.y;
    v.y = pt.z;
    v.z = pt.x;
    break;
  case 2:
    v.x = pt.y;
    v.y = pt.z;
    v.z = pt.x;
    break;
  case 3:
    v.x = pt.x;
    v.y = pt.z;
    v.z = pt.y;
    break;
  case 4:
    v.x = -pt.x;
    v.y = pt.z;
    v.z = pt.y;
    break;
  case 5:
    v.x = -pt.x;
    v.y = pt.y;
    v.z = pt.z;
    break;
  case 6:
  default:
    v.x = pt.x;
    v.y = pt.y;
    v.z = pt.z;
    break;
  }

  return v;
}